

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::BMPattern::BMPattern
          (BMPattern *this,XMLCh *pattern,int tableSize,bool ignoreCase,MemoryManager *manager)

{
  XMLCh *pXVar1;
  CleanupType_conflict cleanup;
  JanitorMemFunCall<xercesc_4_0::BMPattern> local_20;
  
  this->fIgnoreCase = ignoreCase;
  this->fShiftTableLen = tableSize;
  this->fUppercasePattern = (XMLCh *)0x0;
  this->fShiftTable = (XMLSize_t *)0x0;
  this->fPattern = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  local_20.fToCall = (MFPT)cleanUp;
  local_20._16_8_ = 0;
  local_20.fObject = this;
  pXVar1 = XMLString::replicate(pattern,manager);
  this->fPattern = pXVar1;
  initialize(this);
  local_20.fObject = (BMPattern *)0x0;
  JanitorMemFunCall<xercesc_4_0::BMPattern>::~JanitorMemFunCall(&local_20);
  return;
}

Assistant:

BMPattern::BMPattern( const XMLCh*         const pattern
                    ,       int                  tableSize
                    ,       bool                 ignoreCase
                    ,       MemoryManager* const manager) :

    fIgnoreCase(ignoreCase)
    , fShiftTableLen(tableSize)
    , fShiftTable(0)
    , fPattern(0)
    , fUppercasePattern(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &BMPattern::cleanUp);

    try {
        fPattern = XMLString::replicate(pattern, fMemoryManager);
        initialize();
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}